

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deque.h
# Opt level: O0

void __thiscall Deque<int,_std::allocator<int>_>::~Deque(Deque<int,_std::allocator<int>_> *this)

{
  RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
  *in_RDI;
  Deque<int,_std::allocator<int>_> *in_stack_00000020;
  
  reset(in_stack_00000020);
  std::allocator<int>::~allocator((allocator<int> *)0x161b4b);
  RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
  ::~RingBuffer(in_RDI);
  RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
  ::~RingBuffer(in_RDI);
  RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
  ::~RingBuffer(in_RDI);
  return;
}

Assistant:

~Deque() {
        reset();
    }